

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_wav_init_write__internal
                    (ma_dr_wav *pWav,ma_dr_wav_data_format *pFormat,ma_uint64 totalSampleCount)

{
  ma_dr_wav_data_format *pmVar1;
  ma_dr_wav_container mVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  void *pvVar12;
  ulong uVar13;
  ma_uint64 mVar14;
  ulong local_58;
  ma_dr_wav_data_format *local_50;
  ma_uint64 local_48;
  ma_uint64 local_40;
  ulong local_38;
  
  if (pWav->isSequentialWrite == 0) {
    mVar2 = pFormat->container;
    mVar14 = 0;
  }
  else {
    uVar13 = (pWav->fmt).bitsPerSample * totalSampleCount;
    mVar2 = pFormat->container;
    if (mVar2 == ma_dr_wav_container_riff && 0x3ffffff6 < uVar13 >> 5) {
      return 0;
    }
    mVar14 = uVar13 >> 3;
  }
  pWav->dataChunkDataSizeTargetWrite = mVar14;
  local_50 = pFormat;
  local_48 = totalSampleCount;
  if (mVar2 == ma_dr_wav_container_rf64) {
    sVar3 = (*pWav->onWrite)(pWav->pUserData,"RF64",4);
    local_58 = CONCAT44(local_58._4_4_,0xffffffff);
LAB_0016c7b2:
    sVar5 = 4;
    sVar4 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar10 = sVar4 + sVar3;
    pvVar12 = pWav->pUserData;
    pcVar11 = "WAVE";
  }
  else {
    if (mVar2 != ma_dr_wav_container_w64) {
      if (mVar2 != ma_dr_wav_container_riff) {
        return 0;
      }
      sVar3 = (*pWav->onWrite)(pWav->pUserData,"RIFF",4);
      local_58 = CONCAT44(local_58._4_4_,(int)mVar14 + 0x1c);
      goto LAB_0016c7b2;
    }
    sVar5 = 0x10;
    sVar3 = (*pWav->onWrite)(pWav->pUserData,ma_dr_wavGUID_W64_RIFF,0x10);
    local_58 = mVar14 + 0x68;
    sVar4 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    lVar10 = sVar4 + sVar3;
    pvVar12 = pWav->pUserData;
    pcVar11 = (char *)ma_dr_wavGUID_W64_WAVE;
  }
  sVar3 = (*pWav->onWrite)(pvVar12,pcVar11,sVar5);
  lVar10 = sVar3 + lVar10;
  mVar2 = local_50->container;
  local_40 = mVar14;
  if (mVar2 == ma_dr_wav_container_rf64) {
    local_38 = mVar14 + 0x24;
    sVar3 = (*pWav->onWrite)(pWav->pUserData,"ds64",4);
    local_58 = CONCAT44(local_58._4_4_,0x1c);
    sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    local_58 = local_38;
    sVar4 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = mVar14;
    sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = local_48;
    sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    local_58 = local_58 & 0xffffffff00000000;
    sVar8 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar10 = sVar8 + sVar7 + sVar6 + sVar4 + sVar5 + sVar3 + lVar10;
    mVar2 = local_50->container;
  }
  if (mVar2 == ma_dr_wav_container_rf64) {
LAB_0016c8ba:
    sVar3 = (*pWav->onWrite)(pWav->pUserData,"fmt ",4);
    local_58 = CONCAT44(local_58._4_4_,0x10);
    sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar9 = sVar5 + sVar3;
LAB_0016c915:
    lVar10 = lVar10 + lVar9;
  }
  else {
    if (mVar2 == ma_dr_wav_container_w64) {
      sVar3 = (*pWav->onWrite)(pWav->pUserData,ma_dr_wavGUID_W64_FMT,0x10);
      local_58 = 0x28;
      sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
      lVar9 = sVar5 + sVar3;
      goto LAB_0016c915;
    }
    if (mVar2 == ma_dr_wav_container_riff) goto LAB_0016c8ba;
  }
  local_58._0_2_ = (pWav->fmt).formatTag;
  sVar3 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58 = CONCAT62(local_58._2_6_,(pWav->fmt).channels);
  sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58._0_4_ = (pWav->fmt).sampleRate;
  sVar4 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
  local_58 = CONCAT44(local_58._4_4_,(pWav->fmt).avgBytesPerSec);
  sVar6 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
  local_58._0_2_ = (pWav->fmt).blockAlign;
  sVar7 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  local_58 = CONCAT62(local_58._2_6_,(pWav->fmt).bitsPerSample);
  sVar8 = (*pWav->onWrite)(pWav->pUserData,&local_58,2);
  pmVar1 = local_50;
  mVar14 = sVar8 + sVar7 + sVar6 + sVar4 + sVar5 + sVar3 + lVar10;
  if (((pWav->isSequentialWrite == 0) && (pWav->pMetadata != (ma_dr_wav_metadata *)0x0)) &&
     (pWav->metadataCount != 0)) {
    mVar2 = local_50->container;
    if ((mVar2 == ma_dr_wav_container_rf64) || (mVar2 == ma_dr_wav_container_riff)) {
      sVar3 = ma_dr_wav__write_or_count_metadata(pWav,pWav->pMetadata,pWav->metadataCount);
      mVar14 = mVar14 + sVar3;
      goto LAB_0016c9e2;
    }
  }
  else {
LAB_0016c9e2:
    mVar2 = pmVar1->container;
  }
  pWav->dataChunkDataPos = mVar14;
  if (mVar2 == ma_dr_wav_container_rf64) {
    sVar3 = (*pWav->onWrite)(pWav->pUserData,"data",4);
    local_58 = CONCAT44(local_58._4_4_,0xffffffff);
LAB_0016caaf:
    sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,4);
    lVar10 = sVar5 + sVar3;
  }
  else {
    if (mVar2 != ma_dr_wav_container_w64) {
      if (mVar2 != ma_dr_wav_container_riff) goto LAB_0016cabf;
      sVar3 = (*pWav->onWrite)(pWav->pUserData,"data",4);
      local_58 = CONCAT44(local_58._4_4_,(int)local_40);
      goto LAB_0016caaf;
    }
    uVar13 = local_40 + 0x18;
    sVar3 = (*pWav->onWrite)(pWav->pUserData,ma_dr_wavGUID_W64_DATA,0x10);
    local_58 = uVar13;
    sVar5 = (*pWav->onWrite)(pWav->pUserData,&local_58,8);
    lVar10 = sVar5 + sVar3;
  }
  mVar14 = mVar14 + lVar10;
LAB_0016cabf:
  pWav->container = pmVar1->container;
  pWav->channels = (ma_uint16)pmVar1->channels;
  pWav->sampleRate = pmVar1->sampleRate;
  pWav->bitsPerSample = (ma_uint16)pmVar1->bitsPerSample;
  pWav->translatedFormatTag = (ma_uint16)pmVar1->format;
  pWav->dataChunkDataPos = mVar14;
  return 1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_write__internal(ma_dr_wav* pWav, const ma_dr_wav_data_format* pFormat, ma_uint64 totalSampleCount)
{
    size_t runningPos = 0;
    ma_uint64 initialDataChunkSize = 0;
    ma_uint64 chunkSizeFMT;
    if (pWav->isSequentialWrite) {
        initialDataChunkSize = (totalSampleCount * pWav->fmt.bitsPerSample) / 8;
        if (pFormat->container == ma_dr_wav_container_riff) {
            if (initialDataChunkSize > (0xFFFFFFFFUL - 36)) {
                return MA_FALSE;
            }
        }
    }
    pWav->dataChunkDataSizeTargetWrite = initialDataChunkSize;
    if (pFormat->container == ma_dr_wav_container_riff) {
        ma_uint32 chunkSizeRIFF = 28 + (ma_uint32)initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "RIFF", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, chunkSizeRIFF);
        runningPos += ma_dr_wav__write(pWav, "WAVE", 4);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        ma_uint64 chunkSizeRIFF = 80 + 24 + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_RIFF, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeRIFF);
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_WAVE, 16);
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        runningPos += ma_dr_wav__write(pWav, "RF64", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0xFFFFFFFF);
        runningPos += ma_dr_wav__write(pWav, "WAVE", 4);
    } else {
        return MA_FALSE;
    }
    if (pFormat->container == ma_dr_wav_container_rf64) {
        ma_uint32 initialds64ChunkSize = 28;
        ma_uint64 initialRiffChunkSize = 8 + initialds64ChunkSize + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "ds64", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, initialds64ChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, initialRiffChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, initialDataChunkSize);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, totalSampleCount);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0);
    }
    if (pFormat->container == ma_dr_wav_container_riff || pFormat->container == ma_dr_wav_container_rf64) {
        chunkSizeFMT = 16;
        runningPos += ma_dr_wav__write(pWav, "fmt ", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, (ma_uint32)chunkSizeFMT);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        chunkSizeFMT = 40;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_FMT, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeFMT);
    }
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.formatTag);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.channels);
    runningPos += ma_dr_wav__write_u32ne_to_le(pWav, pWav->fmt.sampleRate);
    runningPos += ma_dr_wav__write_u32ne_to_le(pWav, pWav->fmt.avgBytesPerSec);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.blockAlign);
    runningPos += ma_dr_wav__write_u16ne_to_le(pWav, pWav->fmt.bitsPerSample);
    if (!pWav->isSequentialWrite && pWav->pMetadata != NULL && pWav->metadataCount > 0 && (pFormat->container == ma_dr_wav_container_riff || pFormat->container == ma_dr_wav_container_rf64)) {
        runningPos += ma_dr_wav__write_or_count_metadata(pWav, pWav->pMetadata, pWav->metadataCount);
    }
    pWav->dataChunkDataPos = runningPos;
    if (pFormat->container == ma_dr_wav_container_riff) {
        ma_uint32 chunkSizeDATA = (ma_uint32)initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, "data", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == ma_dr_wav_container_w64) {
        ma_uint64 chunkSizeDATA = 24 + initialDataChunkSize;
        runningPos += ma_dr_wav__write(pWav, ma_dr_wavGUID_W64_DATA, 16);
        runningPos += ma_dr_wav__write_u64ne_to_le(pWav, chunkSizeDATA);
    } else if (pFormat->container == ma_dr_wav_container_rf64) {
        runningPos += ma_dr_wav__write(pWav, "data", 4);
        runningPos += ma_dr_wav__write_u32ne_to_le(pWav, 0xFFFFFFFF);
    }
    pWav->container = pFormat->container;
    pWav->channels = (ma_uint16)pFormat->channels;
    pWav->sampleRate = pFormat->sampleRate;
    pWav->bitsPerSample = (ma_uint16)pFormat->bitsPerSample;
    pWav->translatedFormatTag = (ma_uint16)pFormat->format;
    pWav->dataChunkDataPos = runningPos;
    return MA_TRUE;
}